

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O3

void Dsd_TreeUnmark_rec(Dsd_Node_t *pNode)

{
  short sVar1;
  long lVar2;
  
  if (pNode == (Dsd_Node_t *)0x0) {
    __assert_fail("pNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0x83,"void Dsd_TreeUnmark_rec(Dsd_Node_t *)");
  }
  if (((ulong)pNode & 1) == 0) {
    if (0 < pNode->nVisits) {
      sVar1 = pNode->nVisits + -1;
      pNode->nVisits = sVar1;
      if (((sVar1 == 0) && (1 < pNode->Type - DSD_NODE_CONST1)) && (0 < pNode->nDecs)) {
        lVar2 = 0;
        do {
          Dsd_TreeUnmark_rec((Dsd_Node_t *)((ulong)pNode->pDecs[lVar2] & 0xfffffffffffffffe));
          lVar2 = lVar2 + 1;
        } while (lVar2 < pNode->nDecs);
      }
      return;
    }
    __assert_fail("pNode->nVisits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0x85,"void Dsd_TreeUnmark_rec(Dsd_Node_t *)");
  }
  __assert_fail("!Dsd_IsComplement( pNode )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                ,0x84,"void Dsd_TreeUnmark_rec(Dsd_Node_t *)");
}

Assistant:

void Dsd_TreeUnmark_rec( Dsd_Node_t * pNode )
{
    int i;

    assert( pNode );
    assert( !Dsd_IsComplement( pNode ) );
    assert( pNode->nVisits > 0 );

    if ( --pNode->nVisits ) // if this is not the last visit, return
        return;

    // upon the last visit, go through the list of successors and call recursively 
    if ( pNode->Type != DSD_NODE_BUF && pNode->Type != DSD_NODE_CONST1 )
    for ( i = 0; i < pNode->nDecs; i++ )
        Dsd_TreeUnmark_rec( Dsd_Regular(pNode->pDecs[i]) );
}